

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O2

int print_automorphism_ntk
              (FILE *f,int n,int *gamma,int nsupp,int *support,char *marks,Abc_Ntk_t *pNtk)

{
  int iVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  int v;
  char *__format;
  long lVar5;
  
  uVar4 = (ulong)(uint)nsupp;
  if (nsupp < 1) {
    uVar4 = 0;
  }
  for (uVar3 = 0; uVar3 != uVar4; uVar3 = uVar3 + 1) {
    iVar1 = support[uVar3];
    lVar5 = (long)iVar1;
    if (marks[lVar5] == '\0') {
      __format = "(%s";
      v = iVar1;
      while( true ) {
        marks[lVar5] = '\x01';
        pcVar2 = getVertexName(pNtk,v);
        fprintf((FILE *)f,__format,pcVar2);
        v = gamma[lVar5];
        if (v == iVar1) break;
        lVar5 = (long)v;
        __format = " %s";
      }
      fputc(0x29,(FILE *)f);
    }
  }
  fputc(10,(FILE *)f);
  for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    marks[support[uVar3]] = '\0';
  }
  return 1;
}

Assistant:

static int
print_automorphism_ntk(FILE *f, int n, const int *gamma, int nsupp, const int *support, char * marks, Abc_Ntk_t * pNtk)
{
    int i, j, k;    

    /* We presume support is already sorted */
    for (i = 0; i < nsupp; ++i) {
        k = support[i];

        /* Skip elements already seen */
        if (marks[k]) continue;

        /* Start an orbit */
        marks[k] = 1;
        fprintf(f, "(%s", getVertexName(pNtk, k));

        /* Mark and notify elements in this orbit */
        for (j = gamma[k]; j != k; j = gamma[j]) {
            marks[j] = 1;
            fprintf(f, " %s", getVertexName(pNtk, j));
        }

        /* Finish off the orbit */
        fprintf(f, ")");
    }
    fprintf(f, "\n");

    /* Clean up after ourselves */
    for (i = 0; i < nsupp; ++i) {
        marks[support[i]] = 0;
    }

    return 1;
}